

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryInvocationCase::init
          (GeometryInvocationCase *this,EVP_PKEY_CTX *ctx)

{
  int *value;
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *pNVar6;
  MessageBuilder *pMVar7;
  InvocationCountShader *this_00;
  ShaderProgramDeclaration *pSVar8;
  ostream *poVar9;
  int iVar10;
  char *pcVar11;
  OutputCase OVar12;
  ContextType local_4ac;
  int maxGeometryShaderInvocations;
  allocator<char> local_4a4;
  allocator<char> local_4a3;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  int maxComponents;
  FragmentOutput local_49c;
  string local_498;
  GeometrySource local_478;
  string local_458;
  string local_438;
  FragmentSource local_418;
  string local_3f8;
  string local_3d8;
  VertexSource local_3b8;
  string local_398 [32];
  string local_378 [32];
  string local_358;
  GeometryToFragmentVarying local_338;
  VertexToGeometryVarying local_330;
  VertexAttribute local_328;
  VertexAttribute local_300;
  ostringstream buf;
  GeometryShaderDeclaration local_158;
  ShaderProgramDeclaration local_140;
  long lVar5;
  
  iVar3 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  maxGeometryShaderInvocations = 0;
  maxComponents = 0;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->
                       m_contextInfo,"GL_EXT_geometry_shader");
    if (!bVar2) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,"Tests require GL_EXT_geometry_shader extension or higher context version.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0x10e8);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (**(code **)(lVar5 + 0x868))(0x8e5a,&maxGeometryShaderInvocations);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"getIntegerv(GL_MAX_GEOMETRY_SHADER_INVOCATIONS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x10eb);
  (**(code **)(lVar5 + 0x868))(0x8de1,&maxComponents);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x10ee);
  buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
  std::operator<<((ostream *)puVar1,"GL_MAX_GEOMETRY_SHADER_INVOCATIONS = ");
  std::ostream::operator<<(puVar1,maxGeometryShaderInvocations);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&buf,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  value = &this->m_numInvocations;
  iVar3 = this->m_numInvocations;
  if (iVar3 == -1) {
    *value = maxGeometryShaderInvocations;
    iVar3 = maxGeometryShaderInvocations;
  }
  else if (maxGeometryShaderInvocations < iVar3) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buf,"Test requires larger GL_MAX_GEOMETRY_SHADER_INVOCATIONS",
               (allocator<char> *)&local_140);
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)&buf);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_testCase == CASE_FIXED_OUTPUT_COUNTS) {
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Rendering triangles in a partial circle formation with a geometry shader. Each triangle is generated by a separate invocation.\n"
                   );
    std::operator<<((ostream *)puVar1,"Drawing 2 points, each generating ");
    pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)&buf,value);
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    " triangles.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_011f922b:
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  }
  else if (this->m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS) {
    if (maxComponents < iVar3 * 8 + 0x10) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buf,"Test requires larger GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS",
                 (allocator<char> *)&local_140);
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)&buf);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    buf.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    puVar1 = &buf.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,
                    "Rendering n-gons in a partial circle formation with a geometry shader. Each n-gon is generated by a separate invocation.\n"
                   );
    std::operator<<((ostream *)puVar1,"Drawing 2 points, each generating ");
    pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)&buf,value);
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>," n-gons.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_011f922b;
  }
  this_00 = (InvocationCountShader *)operator_new(0x160);
  local_4ac.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  iVar3 = this->m_numInvocations;
  OVar12 = (this->m_testCase != CASE_DIFFERENT_OUTPUT_COUNTS) + CASE_DIFFERENT_OUTPUT_COUNTS;
  if (this->m_testCase == CASE_FIXED_OUTPUT_COUNTS) {
    OVar12 = CASE_FIXED_OUTPUT_COUNTS;
  }
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  std::__cxx11::string::string<std::allocator<char>>(local_378,"a_position",&local_4a1);
  std::__cxx11::string::string((string *)&local_300,local_378);
  local_300.type = GENERICVECTYPE_FLOAT;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_300);
  std::__cxx11::string::string<std::allocator<char>>(local_398,"a_color",&local_4a2);
  std::__cxx11::string::string((string *)&local_328,local_398);
  local_328.type = GENERICVECTYPE_FLOAT;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_328);
  local_330.type = GENERICVECTYPE_FLOAT;
  local_330.flatshade = false;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_330);
  local_338.type = GENERICVECTYPE_FLOAT;
  local_338.flatshade = false;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_338);
  local_49c.type = GENERICVECTYPE_FLOAT;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_49c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
             ,&local_4a3);
  specializeShader(&local_3d8,&local_3f8,&local_4ac);
  std::__cxx11::string::string((string *)&local_3b8,(string *)&local_3d8);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,&local_4a4);
  specializeShader(&local_438,&local_458,&local_4ac);
  std::__cxx11::string::string((string *)&local_418,(string *)&local_438);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_418);
  local_158.numInvocations = (size_t)iVar3;
  if (OVar12 == CASE_FIXED_OUTPUT_COUNTS) {
    local_158.numOutputVertices = 3;
  }
  else if (OVar12 == CASE_DIFFERENT_OUTPUT_COUNTS) {
    local_158.numOutputVertices = (size_t)(iVar3 + 2);
  }
  else {
    local_158.numOutputVertices = 0;
  }
  local_158.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_158.outputType = GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_158);
  if (OVar12 == CASE_FIXED_OUTPUT_COUNTS) {
    iVar10 = 3;
  }
  else if (OVar12 == CASE_DIFFERENT_OUTPUT_COUNTS) {
    iVar10 = iVar3 + 2;
  }
  else {
    iVar10 = 0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar9 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,
                           "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points, invocations = "
                          );
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar3);
  poVar9 = std::operator<<(poVar9,") in;\nlayout(triangle_strip, max_vertices = ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar10);
  poVar9 = std::operator<<(poVar9,
                           ") out;\n\nin highp vec4 v_geom_FragColor[];\nout highp vec4 v_frag_FragColor;\n\nvoid main ()\n{\n\thighp float l_angle = float(gl_InvocationID) / float("
                          );
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar3);
  std::operator<<(poVar9,") * 5.5;\n\thighp float l_radius = 0.6;\n\n");
  if (OVar12 == CASE_DIFFERENT_OUTPUT_COUNTS) {
    pcVar11 = 
    "\thighp vec4 l_color = vec4(float(gl_InvocationID % 2), (((gl_InvocationID / 2) % 2) == 0) ? (1.0) : (0.0), 1.0, 1.0);\n\thighp vec4 basePosition = gl_in[0].gl_Position + vec4(cos(l_angle) * l_radius, sin(l_angle) * l_radius, 0.0, 0.0);\n\tmediump int numNgonVtx = gl_InvocationID + 3;\n\n\tfor (int ndx = 0; ndx + 1 < numNgonVtx; ndx += 2)\n\t{\n\t\thighp float sub_angle = (float(ndx) + 1.0) / float(numNgonVtx) * 3.141;\n\n\t\tv_frag_FragColor = l_color;\n\t\tgl_Position = basePosition + vec4(cos(sub_angle) * 0.1, sin(sub_angle) * 0.1, 0.0, 0.0);\n\t\tEmitVertex();\n\n\t\tv_frag_FragColor = l_color;\n\t\tgl_Position = basePosition + vec4(cos(sub_angle) * 0.1, sin(sub_angle) * -0.1, 0.0, 0.0);\n\t\tEmitVertex();\n\t}\n\tif ((numNgonVtx % 2) == 1)\n\t{\n\t\tv_frag_FragColor = l_color;\n\t\tgl_Position = basePosition + vec4(-0.1, 0.0, 0.0, 0.0);\n\t\tEmitVertex();\n\t}\n"
    ;
  }
  else {
    if (OVar12 != CASE_FIXED_OUTPUT_COUNTS) goto LAB_011f94ed;
    pcVar11 = 
    "\tv_frag_FragColor = vec4(1.0, 1.0, 0.0, 1.0) * v_geom_FragColor[0];\n\tgl_Position = gl_in[0].gl_Position + vec4(cos(l_angle) * (l_radius - 0.1), sin(l_angle) * (l_radius - 0.1), 0.0, 0.0);\n\tEmitVertex();\n\n\tv_frag_FragColor = vec4(1.0, 0.0, 0.0, 1.0) * v_geom_FragColor[0];\n\tgl_Position = gl_in[0].gl_Position + vec4(cos(l_angle+0.1) * l_radius, sin(l_angle+0.1) * l_radius, 0.0, 0.0);\n\tEmitVertex();\n\n\tv_frag_FragColor = vec4(1.0, 0.0, 0.0, 1.0) * v_geom_FragColor[0];\n\tgl_Position = gl_in[0].gl_Position + vec4(cos(l_angle-0.1) * l_radius, sin(l_angle-0.1) * l_radius, 0.0, 0.0);\n\tEmitVertex();\n"
    ;
  }
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,pcVar11);
LAB_011f94ed:
  std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::__cxx11::stringbuf::str();
  specializeShader(&local_498,&local_358,&local_4ac);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  std::__cxx11::string::string((string *)&local_478,(string *)&local_498);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,&local_478);
  sglr::ShaderProgram::ShaderProgram((ShaderProgram *)this_00,pSVar8);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string(local_378);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this_00->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e4fae0;
  (this_00->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e4fb18;
  (this_00->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e4fb30;
  *(int *)&(this_00->super_ShaderProgram).field_0x154 = iVar3;
  this_00->m_testCase = OVar12;
  this->m_program = this_00;
  iVar3 = GeometryShaderRenderTest::init
                    (&this->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pSVar8);
  return iVar3;
}

Assistant:

void GeometryInvocationCase::init (void)
{
	const glw::Functions&	gl								= m_context.getRenderContext().getFunctions();
	int						maxGeometryShaderInvocations	= 0;
	int						maxComponents					= 0;

	// requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	gl.getIntegerv(GL_MAX_GEOMETRY_SHADER_INVOCATIONS, &maxGeometryShaderInvocations);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv(GL_MAX_GEOMETRY_SHADER_INVOCATIONS)");

	gl.getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &maxComponents);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS)");

	m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_SHADER_INVOCATIONS = " << maxGeometryShaderInvocations << tcu::TestLog::EndMessage;

	// set target num invocations

	if (m_numInvocations == -1)
		m_numInvocations = maxGeometryShaderInvocations;
	else if (maxGeometryShaderInvocations < m_numInvocations)
		throw tcu::NotSupportedError("Test requires larger GL_MAX_GEOMETRY_SHADER_INVOCATIONS");

	if (m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS)
	{
		const int maxEmitCount	= m_numInvocations + 2;
		const int numComponents	= 8; // pos + color
		if (maxEmitCount * numComponents > maxComponents)
			throw tcu::NotSupportedError("Test requires larger GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS");
	}

	// Log what the test tries to do

	if (m_testCase == CASE_FIXED_OUTPUT_COUNTS)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Rendering triangles in a partial circle formation with a geometry shader. Each triangle is generated by a separate invocation.\n"
			<< "Drawing 2 points, each generating " << m_numInvocations << " triangles."
			<< tcu::TestLog::EndMessage;
	}
	else if (m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Rendering n-gons in a partial circle formation with a geometry shader. Each n-gon is generated by a separate invocation.\n"
			<< "Drawing 2 points, each generating " << m_numInvocations << " n-gons."
			<< tcu::TestLog::EndMessage;
	}
	else
		DE_ASSERT(false);

	// resources

	m_program = new InvocationCountShader(m_context.getRenderContext().getType(), m_numInvocations, mapToShaderCaseType(m_testCase));

	GeometryShaderRenderTest::init();
}